

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vox2obj.cpp
# Opt level: O0

FILE * open_obj_file(char *filename)

{
  uint local_24;
  float u;
  uint32_t i;
  FILE *fout;
  char *filename_local;
  
  filename_local = (char *)open_file(filename,"wb");
  if ((FILE *)filename_local == (FILE *)0x0) {
    printf("could not open file \'%s\' for write - aborting!",filename);
    filename_local = (char *)0x0;
  }
  else {
    printf("writing file %s\n",filename);
    fprintf((FILE *)filename_local,"vn 1 0 0\n");
    fprintf((FILE *)filename_local,"vn -1 0 0\n");
    fprintf((FILE *)filename_local,"vn 0 1 0\n");
    fprintf((FILE *)filename_local,"vn 0 -1 0\n");
    fprintf((FILE *)filename_local,"vn 0 0 1\n");
    fprintf((FILE *)filename_local,"vn 0 0 -1\n");
    for (local_24 = 0; local_24 < 0x100; local_24 = local_24 + 1) {
      fprintf((FILE *)filename_local,"vt %f 0.5\n",(double)(((float)local_24 + 0.5) * 0.00390625));
    }
  }
  return (FILE *)filename_local;
}

Assistant:

FILE* open_obj_file(const char* filename)
{
    FILE * fout = open_file(filename, "wb");
    if (!fout) {
        printf("could not open file '%s' for write - aborting!", filename);
        return nullptr;
    }
    printf("writing file %s\n", filename);
    // there will only ever be 6 normals, so write them out only once.
    fprintf(fout, "vn 1 0 0\n");
    fprintf(fout, "vn -1 0 0\n");
    fprintf(fout, "vn 0 1 0\n");
    fprintf(fout, "vn 0 -1 0\n");
    fprintf(fout, "vn 0 0 1\n");
    fprintf(fout, "vn 0 0 -1\n");

    // there will only ever be up to 256 texcoords, so write them out only once
    for (uint32_t i = 0; i < 256; i++) {
        float u = (0.5f + (float)i) * (1.0f / 256.0f);
        fprintf(fout, "vt %f 0.5\n", u);
    }
    return fout;
}